

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

BinaryenExpressionRef
BinaryenArrayGet(BinaryenModuleRef module,BinaryenExpressionRef ref,BinaryenExpressionRef index,
                BinaryenType type,bool signed_)

{
  BinaryenType index_00;
  BinaryenExpressionRef ref_00;
  ArrayGet *pAVar1;
  Type local_40;
  Builder local_38;
  byte local_29;
  BinaryenType BStack_28;
  bool signed__local;
  BinaryenType type_local;
  BinaryenExpressionRef index_local;
  BinaryenExpressionRef ref_local;
  BinaryenModuleRef module_local;
  
  local_29 = signed_;
  BStack_28 = type;
  type_local = (BinaryenType)index;
  index_local = ref;
  ref_local = (BinaryenExpressionRef)module;
  wasm::Builder::Builder(&local_38,module);
  ref_00 = index_local;
  index_00 = type_local;
  wasm::Type::Type(&local_40,BStack_28);
  pAVar1 = wasm::Builder::makeArrayGet
                     (&local_38,ref_00,(Expression *)index_00,local_40,(bool)(local_29 & 1));
  return (BinaryenExpressionRef)pAVar1;
}

Assistant:

BinaryenExpressionRef BinaryenArrayGet(BinaryenModuleRef module,
                                       BinaryenExpressionRef ref,
                                       BinaryenExpressionRef index,
                                       BinaryenType type,
                                       bool signed_) {
  return static_cast<Expression*>(
    Builder(*(Module*)module)
      .makeArrayGet((Expression*)ref, (Expression*)index, Type(type), signed_));
}